

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O2

void tcu::anon_unknown_0::decompressETC2_EAC_RGBA8(PixelBufferAccess *dst,deUint8 *src)

{
  int iVar1;
  void *pvVar2;
  deUint64 dVar3;
  deUint64 src_00;
  deUint8 *pdVar4;
  int iVar5;
  deUint8 *pdVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  deUint8 *pdVar11;
  int x;
  long lVar12;
  uint uVar13;
  deUint8 uncompressedBlockAlpha [16];
  deUint8 uncompressedBlockRGB [48];
  
  pdVar6 = uncompressedBlockAlpha;
  pvVar2 = (dst->super_ConstPixelBufferAccess).m_data;
  iVar1 = (dst->super_ConstPixelBufferAccess).m_pitch.m_data[1];
  uVar13 = 0;
  dVar3 = EtcDecompressInternal::get64BitBlock(src,0);
  src_00 = EtcDecompressInternal::get64BitBlock(src,1);
  EtcDecompressInternal::decompressETC2Block(uncompressedBlockRGB,src_00,(deUint8 *)0x0,false);
  uVar10 = 0;
  for (uVar7 = 0x2d; uVar7 != 0xfffffffffffffffd; uVar7 = uVar7 - 3) {
    iVar5 = *(int *)((long)EtcDecompressInternal::decompressEAC11Block::modifierTable[0] +
                    (ulong)((uint)((dVar3 >> (uVar7 & 0x3f) & 1) != 0) +
                            ((uint)(dVar3 >> ((char)uVar7 + 1U & 0x3f)) & 1) * 2 +
                           ((uint)(dVar3 >> ((char)uVar7 + 2U & 0x3f)) & 1) * 4) * 4 +
                    (ulong)(((ushort)(dVar3 >> 0x30) & 0xf) << 5)) * ((uint)(dVar3 >> 0x34) & 0xf) +
            (uint)(byte)(dVar3 >> 0x38);
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    uncompressedBlockAlpha[uVar10 & 0xc | uVar13 >> 2] = (deUint8)iVar5;
    uVar10 = uVar10 + 4;
    uVar13 = uVar13 + 1;
  }
  pdVar4 = uncompressedBlockRGB + 2;
  iVar5 = 0;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    lVar9 = (long)iVar5;
    pdVar11 = pdVar4;
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      *(deUint8 *)((long)pvVar2 + lVar12 * 4 + lVar9) = pdVar11[-2];
      *(deUint8 *)((long)pvVar2 + lVar12 * 4 + lVar9 + 1) = pdVar11[-1];
      *(deUint8 *)((long)pvVar2 + lVar12 * 4 + lVar9 + 2) = *pdVar11;
      *(deUint8 *)((long)pvVar2 + lVar12 * 4 + lVar9 + 3) = pdVar6[lVar12];
      pdVar11 = pdVar11 + 3;
    }
    pdVar6 = pdVar6 + 4;
    pdVar4 = pdVar4 + 0xc;
    iVar5 = iVar5 + iVar1;
  }
  return;
}

Assistant:

void decompressETC2_EAC_RGBA8 (const PixelBufferAccess& dst, const deUint8* src)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8;

	const deUint64	compressedBlockAlpha	= get128BitBlockStart(src, 0);
	const deUint64	compressedBlockRGB		= get128BitBlockEnd(src, 0);
	deUint8			uncompressedBlockAlpha[ETC2_UNCOMPRESSED_BLOCK_SIZE_A8];
	deUint8			uncompressedBlockRGB[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8];

	// Decompress.
	decompressETC2Block(uncompressedBlockRGB, compressedBlockRGB, NULL, false);
	decompressEAC8Block(uncompressedBlockAlpha, compressedBlockAlpha);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			const deUint8* const	srcPixelRGB		= &uncompressedBlockRGB[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8];
			const deUint8* const	srcPixelAlpha	= &uncompressedBlockAlpha[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8];
			deUint8* const			dstPixel		= dstPtr + y*dstRowPitch + x*dstPixelSize;

			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8 == 4);
			dstPixel[0] = srcPixelRGB[0];
			dstPixel[1] = srcPixelRGB[1];
			dstPixel[2] = srcPixelRGB[2];
			dstPixel[3] = srcPixelAlpha[0];
		}
	}
}